

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O3

void __thiscall Solver_MCSVM_CS::Solve(Solver_MCSVM_CS *this,double *w)

{
  double *pdVar1;
  undefined4 uVar2;
  int iVar3;
  double *pdVar4;
  feature_node **ppfVar5;
  problem *ppVar6;
  double *pdVar7;
  bool bVar8;
  bool bVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  void *__s;
  double *alpha_new;
  void *pvVar14;
  void *pvVar15;
  void *pvVar16;
  void *pvVar17;
  void *pvVar18;
  void *pvVar19;
  void *pvVar20;
  feature_node *pfVar21;
  int iVar22;
  uint uVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  void *pvVar28;
  feature_node *pfVar29;
  int iVar30;
  long lVar31;
  int t;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  long lVar35;
  ulong uVar36;
  double dVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  double dVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  double t_1;
  double dVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  double dVar49;
  int iVar50;
  double dVar51;
  double dVar52;
  undefined1 auVar53 [16];
  int iVar54;
  undefined1 auVar55 [16];
  int local_10c;
  double local_d0;
  long lVar44;
  
  iVar12 = this->l;
  uVar32 = (ulong)iVar12;
  uVar23 = this->nr_class;
  lVar25 = (long)(int)uVar23;
  uVar11 = uVar23 * iVar12;
  uVar27 = (long)(int)uVar11 * 8;
  if ((int)uVar11 < 0) {
    uVar27 = 0xffffffffffffffff;
  }
  uVar13 = (long)(int)uVar11 * 4;
  if ((int)uVar11 < 0) {
    uVar13 = 0xffffffffffffffff;
  }
  __s = operator_new__(uVar27);
  uVar27 = lVar25 * 8;
  if (lVar25 < 0) {
    uVar27 = 0xffffffffffffffff;
  }
  uVar34 = lVar25 * 4;
  if (lVar25 < 0) {
    uVar34 = 0xffffffffffffffff;
  }
  alpha_new = (double *)operator_new__(uVar27);
  uVar36 = uVar32 * 4;
  if ((long)uVar32 < 0) {
    uVar36 = 0xffffffffffffffff;
  }
  uVar33 = uVar32 * 8;
  if ((long)uVar32 < 0) {
    uVar33 = 0xffffffffffffffff;
  }
  pvVar14 = operator_new__(uVar36);
  pvVar15 = operator_new__(uVar33);
  pvVar16 = operator_new__(uVar34);
  pvVar17 = operator_new__(uVar27);
  pvVar18 = operator_new__(uVar13);
  pvVar19 = operator_new__(uVar36);
  pvVar20 = operator_new__(uVar36);
  local_d0 = this->eps;
  if (0 < (int)uVar11) {
    memset(__s,0,(ulong)uVar11 << 3);
  }
  uVar11 = this->w_size * uVar23;
  if (0 < (int)uVar11) {
    memset(w,0,(ulong)uVar11 << 3);
  }
  auVar41 = _DAT_0010c0d0;
  auVar46 = _DAT_0010c0c0;
  auVar55 = _DAT_0010c0b0;
  if (0 < iVar12) {
    pdVar4 = this->prob->y;
    ppfVar5 = this->prob->x;
    lVar25 = (ulong)uVar23 - 1;
    auVar38._8_4_ = (int)lVar25;
    auVar38._0_8_ = lVar25;
    auVar38._12_4_ = (int)((ulong)lVar25 >> 0x20);
    lVar25 = (long)pvVar18 + 4;
    uVar27 = 0;
    auVar38 = auVar38 ^ _DAT_0010c0c0;
    do {
      if (0 < (int)uVar23) {
        uVar13 = 0;
        auVar53 = auVar55;
        do {
          bVar8 = auVar38._0_4_ < SUB164(auVar53 ^ auVar46,0);
          iVar12 = auVar38._4_4_;
          iVar54 = SUB164(auVar53 ^ auVar46,4);
          if ((bool)(~(iVar12 < iVar54 || iVar54 == iVar12 && bVar8) & 1)) {
            *(int *)(lVar25 + -4 + uVar13 * 4) = (int)uVar13;
          }
          if (iVar12 >= iVar54 && (iVar54 != iVar12 || !bVar8)) {
            *(int *)(lVar25 + uVar13 * 4) = (int)uVar13 + 1;
          }
          uVar13 = uVar13 + 2;
          lVar26 = auVar53._8_8_;
          auVar53._0_8_ = auVar53._0_8_ + auVar41._0_8_;
          auVar53._8_8_ = lVar26 + auVar41._8_8_;
        } while ((uVar23 + 1 & 0xfffffffe) != uVar13);
      }
      pfVar21 = ppfVar5[uVar27];
      *(undefined8 *)((long)pvVar15 + uVar27 * 8) = 0;
      if (pfVar21->index != -1) {
        dVar51 = 0.0;
        do {
          pfVar29 = pfVar21 + 1;
          dVar51 = dVar51 + pfVar21->value * pfVar21->value;
          *(double *)((long)pvVar15 + uVar27 * 8) = dVar51;
          pfVar21 = pfVar29;
        } while (pfVar29->index != -1);
      }
      *(uint *)((long)pvVar20 + uVar27 * 4) = uVar23;
      *(int *)((long)pvVar19 + uVar27 * 4) = (int)pdVar4[uVar27];
      *(int *)((long)pvVar14 + uVar27 * 4) = (int)uVar27;
      uVar27 = uVar27 + 1;
      lVar25 = lVar25 + (ulong)uVar23 * 4;
    } while (uVar27 != uVar32);
  }
  if (this->max_iter < 1) {
    local_10c = 0;
  }
  else {
    local_d0 = local_d0 * 10.0;
    if (local_d0 <= 1.0) {
      local_d0 = 1.0;
    }
    local_10c = 0;
    auVar55 = _DAT_0010c0c0;
    bVar8 = true;
    do {
      if ((int)uVar32 < 1) {
        dVar51 = -INFINITY;
      }
      else {
        uVar27 = uVar32 & 0xffffffff;
        uVar13 = uVar32 & 0xffffffff;
        uVar34 = 0;
        do {
          iVar12 = rand();
          lVar25 = (long)(iVar12 % (int)uVar13) + uVar34;
          uVar2 = *(undefined4 *)((long)pvVar14 + uVar34 * 4);
          *(undefined4 *)((long)pvVar14 + uVar34 * 4) = *(undefined4 *)((long)pvVar14 + lVar25 * 4);
          *(undefined4 *)((long)pvVar14 + lVar25 * 4) = uVar2;
          uVar34 = uVar34 + 1;
          uVar13 = (ulong)((int)uVar13 - 1);
        } while (uVar27 != uVar34);
        dVar51 = -INFINITY;
        auVar55 = _DAT_0010c0c0;
        if (0 < (int)uVar32) {
          iVar12 = 0;
          dVar51 = -INFINITY;
          do {
            iVar54 = *(int *)((long)pvVar14 + (long)iVar12 * 4);
            lVar25 = (long)iVar54;
            dVar37 = *(double *)((long)pvVar15 + lVar25 * 8);
            if (0.0 < dVar37) {
              iVar24 = this->nr_class;
              uVar23 = *(uint *)((long)pvVar20 + lVar25 * 4);
              uVar32 = (ulong)uVar23;
              if (0 < (int)uVar23) {
                pdVar4 = this->G;
                lVar26 = uVar32 - 1;
                auVar41._8_4_ = (int)lVar26;
                auVar41._0_8_ = lVar26;
                auVar41._12_4_ = (int)((ulong)lVar26 >> 0x20);
                lVar26 = 0;
                auVar46 = _DAT_0010c0b0;
                do {
                  bVar9 = SUB164(auVar41 ^ auVar55,0) < SUB164(auVar46 ^ auVar55,0);
                  iVar22 = SUB164(auVar41 ^ auVar55,4);
                  iVar50 = SUB164(auVar46 ^ auVar55,4);
                  if ((bool)(~(iVar22 < iVar50 || iVar50 == iVar22 && bVar9) & 1)) {
                    *(undefined8 *)((long)pdVar4 + lVar26) = 0x3ff0000000000000;
                  }
                  if (iVar22 >= iVar50 && (iVar50 != iVar22 || !bVar9)) {
                    *(undefined8 *)((long)pdVar4 + lVar26 + 8) = 0x3ff0000000000000;
                  }
                  lVar44 = auVar46._8_8_;
                  auVar46._0_8_ = auVar46._0_8_ + 2;
                  auVar46._8_8_ = lVar44 + 2;
                  lVar26 = lVar26 + 0x10;
                } while ((ulong)(uVar23 + 1 >> 1) << 4 != lVar26);
              }
              uVar11 = *(uint *)((long)pvVar19 + lVar25 * 4);
              if ((int)uVar11 < (int)uVar23) {
                this->G[(int)uVar11] = 0.0;
              }
              lVar26 = (long)(iVar24 * iVar54);
              ppVar6 = this->prob;
              pfVar21 = ppVar6->x[lVar25];
              iVar22 = pfVar21->index;
              if (iVar22 != -1) {
                pdVar4 = this->G;
                do {
                  if (0 < (int)uVar23) {
                    uVar13 = 0;
                    do {
                      pdVar4[uVar13] =
                           w[(long)((iVar22 + -1) * iVar24) +
                             (long)*(int *)((long)pvVar18 + uVar13 * 4 + lVar26 * 4)] *
                           pfVar21->value + pdVar4[uVar13];
                      uVar13 = uVar13 + 1;
                    } while (uVar32 != uVar13);
                  }
                  iVar22 = pfVar21[1].index;
                  pfVar21 = pfVar21 + 1;
                } while (iVar22 != -1);
              }
              dVar40 = INFINITY;
              dVar52 = -INFINITY;
              if (0 < (int)uVar23) {
                uVar13 = 0;
                auVar47 = ZEXT816(0xfff0000000000000);
                auVar46 = ZEXT816(0x7ff0000000000000);
                do {
                  dVar52 = this->G[uVar13];
                  auVar42._8_8_ = 0;
                  auVar42._0_8_ = dVar52;
                  if (0.0 <= *(double *)
                              ((long)__s +
                              (long)*(int *)((long)pvVar18 + uVar13 * 4 + lVar26 * 4) * 8 +
                              lVar26 * 8) || auVar46._0_8_ <= dVar52) {
                    auVar42 = auVar46;
                  }
                  dVar40 = auVar42._0_8_;
                  if (dVar52 <= auVar47._0_8_) {
                    dVar52 = auVar47._0_8_;
                  }
                  uVar13 = uVar13 + 1;
                  auVar47._8_8_ = 0;
                  auVar47._0_8_ = dVar52;
                  auVar46 = auVar42;
                } while (uVar32 != uVar13);
              }
              if ((((int)uVar11 < (int)uVar23) &&
                  (pdVar4 = (double *)((long)__s + (long)(int)ppVar6->y[lVar25] * 8 + lVar26 * 8),
                  *pdVar4 <= this->C[(int)ppVar6->y[lVar25]] &&
                  this->C[(int)ppVar6->y[lVar25]] != *pdVar4)) && (this->G[(int)uVar11] < dVar40)) {
                dVar40 = this->G[(int)uVar11];
              }
              if ((int)uVar23 < 1) {
                *(uint *)((long)pvVar20 + lVar25 * 4) = uVar23;
              }
              else {
                pdVar4 = this->C;
                pdVar7 = this->G;
                uVar13 = 0;
                do {
                  dVar45 = 0.0;
                  if (uVar13 == uVar11) {
                    dVar45 = pdVar4[(int)ppVar6->y[lVar25]];
                  }
                  iVar24 = *(int *)((long)pvVar18 + uVar13 * 4 + lVar26 * 4);
                  pdVar1 = (double *)((long)__s + (long)iVar24 * 8 + lVar26 * 8);
                  if (((dVar45 == *pdVar1) && (!NAN(dVar45) && !NAN(*pdVar1))) &&
                     (dVar45 = pdVar7[uVar13], dVar45 < dVar40)) {
                    iVar22 = (int)uVar32;
                    lVar31 = (long)iVar22;
                    lVar44 = lVar31 * 4 + lVar26 * 4 + -4;
                    lVar10 = 0;
                    do {
                      lVar35 = lVar10;
                      iVar50 = (int)lVar35;
                      if (lVar31 + -1 + lVar35 <= (long)uVar13) {
                        uVar32 = (ulong)((iVar22 + iVar50) - 1);
                        goto LAB_00104d4a;
                      }
                      dVar49 = 0.0;
                      iVar30 = ((iVar22 + -1) - uVar11) + iVar50;
                      if (iVar30 == 0) {
                        dVar49 = this->C[(int)ppVar6->y[lVar25]];
                      }
                      iVar3 = *(int *)((long)pvVar18 + lVar35 * 4 + lVar44);
                      pdVar1 = (double *)((long)__s + (long)iVar3 * 8 + lVar26 * 8);
                    } while (((dVar49 == *pdVar1) && (!NAN(dVar49) && !NAN(*pdVar1))) &&
                            (lVar10 = lVar35 + -1,
                            this->G[lVar31 + lVar35 + -1] <= dVar40 &&
                            dVar40 != this->G[lVar31 + lVar35 + -1]));
                    uVar23 = iVar22 + -1 + iVar50;
                    uVar32 = (ulong)uVar23;
                    if (uVar13 == uVar11) {
                      uVar11 = uVar23;
                    }
                    *(int *)((long)pvVar18 + uVar13 * 4 + lVar26 * 4) = iVar3;
                    *(int *)((long)pvVar18 + lVar35 * 4 + lVar44) = iVar24;
                    pdVar7[uVar13] = pdVar7[lVar31 + lVar35 + -1];
                    pdVar7[lVar31 + lVar35 + -1] = dVar45;
                    if (iVar30 == 0) {
                      uVar11 = (uint)uVar13;
                    }
                  }
LAB_00104d4a:
                  uVar13 = uVar13 + 1;
                  iVar24 = (int)uVar32;
                } while ((long)uVar13 < (long)iVar24);
                *(uint *)((long)pvVar19 + lVar25 * 4) = uVar11;
                *(int *)((long)pvVar20 + lVar25 * 4) = iVar24;
                if (1 < iVar24) {
                  dVar52 = dVar52 - dVar40;
                  if (1e-12 < dVar52) {
                    if (dVar52 <= dVar51) {
                      dVar52 = dVar51;
                    }
                    dVar51 = dVar52;
                    pdVar4 = this->B;
                    pdVar7 = this->G;
                    uVar13 = 0;
                    do {
                      pdVar4[uVar13] =
                           *(double *)
                            ((long)__s +
                            (long)*(int *)((long)pvVar18 + uVar13 * 4 + lVar26 * 4) * 8 + lVar26 * 8
                            ) * -dVar37 + pdVar7[uVar13];
                      uVar13 = uVar13 + 1;
                    } while (uVar32 != uVar13);
                    solve_sub_problem(this,dVar37,uVar11,this->C[(int)ppVar6->y[lVar25]],iVar24,
                                      alpha_new);
                    auVar55 = _DAT_0010c0c0;
                    uVar13 = 0;
                    uVar23 = 0;
                    uVar34 = (ulong)DAT_0010c0e0;
                    do {
                      iVar54 = *(int *)((long)pvVar18 + uVar13 * 4 + lVar26 * 4);
                      dVar37 = alpha_new[uVar13] -
                               *(double *)((long)__s + (long)iVar54 * 8 + lVar26 * 8);
                      *(double *)((long)__s + (long)iVar54 * 8 + lVar26 * 8) = alpha_new[uVar13];
                      if (1e-12 <= (double)((ulong)dVar37 & uVar34)) {
                        *(int *)((long)pvVar16 + (long)(int)uVar23 * 4) = iVar54;
                        *(double *)((long)pvVar17 + (long)(int)uVar23 * 8) = dVar37;
                        uVar23 = uVar23 + 1;
                      }
                      uVar13 = uVar13 + 1;
                    } while (uVar32 != uVar13);
                    pfVar21 = this->prob->x[lVar25];
                    iVar54 = pfVar21->index;
                    if (iVar54 != -1) {
                      iVar24 = this->nr_class;
                      do {
                        if (0 < (int)uVar23) {
                          lVar25 = ((long)iVar54 + -1) * (long)iVar24;
                          uVar32 = 0;
                          do {
                            lVar26 = (long)*(int *)((long)pvVar16 + uVar32 * 4);
                            w[lVar25 + lVar26] =
                                 *(double *)((long)pvVar17 + uVar32 * 8) * pfVar21->value +
                                 w[lVar25 + lVar26];
                            uVar32 = uVar32 + 1;
                          } while (uVar23 != uVar32);
                        }
                        iVar54 = pfVar21[1].index;
                        pfVar21 = pfVar21 + 1;
                      } while (iVar54 != -1);
                    }
                  }
                  goto LAB_00104f50;
                }
              }
              iVar24 = (int)uVar27;
              uVar27 = (ulong)(iVar24 - 1);
              *(undefined4 *)((long)pvVar14 + (long)iVar12 * 4) =
                   *(undefined4 *)((long)pvVar14 + (long)iVar24 * 4 + -4);
              *(int *)((long)pvVar14 + (long)iVar24 * 4 + -4) = iVar54;
              iVar12 = iVar12 + -1;
            }
LAB_00104f50:
            iVar12 = iVar12 + 1;
            uVar32 = uVar27;
          } while (iVar12 < (int)uVar27);
        }
      }
      local_10c = local_10c + 1;
      if (((uint)(local_10c * -0x33333333) >> 1 |
          (uint)((local_10c * -0x33333333 & 1U) != 0) << 0x1f) < 0x1999999a) {
        info(".");
        auVar55 = _DAT_0010c0c0;
      }
      auVar46 = _DAT_0010c100;
      bVar9 = dVar51 < local_d0;
      if (dVar51 < local_d0) {
        if ((bool)(bVar8 & dVar51 < this->eps)) break;
        iVar12 = this->l;
        uVar32 = (ulong)iVar12;
        lVar25 = (long)DAT_0010c100;
        if (0 < (long)uVar32) {
          iVar54 = this->nr_class;
          lVar26 = uVar32 - 1;
          auVar39._8_4_ = (int)lVar26;
          auVar39._0_8_ = lVar26;
          auVar39._12_4_ = (int)((ulong)lVar26 >> 0x20);
          lVar26 = 0;
          auVar43 = _DAT_0010c0b0;
          auVar48 = _DAT_0010c0f0;
          do {
            iVar24 = SUB164(auVar39 ^ auVar55,0);
            bVar8 = iVar24 < SUB164(auVar43 ^ auVar55,0);
            iVar22 = SUB164(auVar39 ^ auVar55,4);
            iVar50 = SUB164(auVar43 ^ auVar55,4);
            if ((bool)(~(iVar22 < iVar50 || iVar50 == iVar22 && bVar8) & 1)) {
              *(int *)((long)pvVar20 + lVar26) = iVar54;
            }
            if (iVar22 >= iVar50 && (iVar50 != iVar22 || !bVar8)) {
              *(int *)((long)pvVar20 + lVar26 + 4) = iVar54;
            }
            iVar50 = SUB164(auVar48 ^ auVar55,4);
            if (iVar50 <= iVar22 && (iVar50 != iVar22 || SUB164(auVar48 ^ auVar55,0) <= iVar24)) {
              *(int *)((long)pvVar20 + lVar26 + 8) = iVar54;
              *(int *)((long)pvVar20 + lVar26 + 0xc) = iVar54;
            }
            lVar44 = auVar43._8_8_;
            auVar43._0_8_ = auVar43._0_8_ + lVar25;
            auVar43._8_8_ = lVar44 + auVar46._8_8_;
            lVar44 = auVar48._8_8_;
            auVar48._0_8_ = auVar48._0_8_ + lVar25;
            auVar48._8_8_ = lVar44 + auVar46._8_8_;
            lVar26 = lVar26 + 0x10;
          } while ((ulong)(iVar12 + 3U >> 2) << 4 != lVar26);
        }
        info("*");
        local_d0 = local_d0 * 0.5;
        auVar55 = _DAT_0010c0c0;
        if (local_d0 <= this->eps) {
          local_d0 = this->eps;
        }
      }
      bVar8 = bVar9;
    } while (local_10c < this->max_iter);
  }
  info("\noptimization finished, #iter = %d\n");
  if (this->max_iter <= local_10c) {
    info("\nWARNING: reaching max number of iterations\n");
  }
  iVar12 = this->nr_class;
  uVar23 = this->w_size * iVar12;
  if ((int)uVar23 < 1) {
    dVar51 = 0.0;
  }
  else {
    dVar51 = 0.0;
    uVar27 = 0;
    do {
      dVar51 = dVar51 + w[uVar27] * w[uVar27];
      uVar27 = uVar27 + 1;
    } while (uVar23 != uVar27);
    dVar51 = dVar51 * 0.5;
  }
  uVar23 = this->l;
  if ((int)(uVar23 * iVar12) < 1) {
    uVar11 = 0;
  }
  else {
    uVar27 = 0;
    uVar11 = 0;
    do {
      dVar37 = *(double *)((long)__s + uVar27 * 8);
      dVar51 = dVar51 + dVar37;
      uVar11 = uVar11 + (dVar37 != 0.0);
      uVar27 = uVar27 + 1;
    } while (uVar23 * iVar12 != uVar27);
  }
  if (0 < (int)uVar23) {
    uVar27 = 0;
    pvVar28 = __s;
    do {
      dVar51 = dVar51 - *(double *)((long)pvVar28 + (long)(int)this->prob->y[uVar27] * 8);
      uVar27 = uVar27 + 1;
      pvVar28 = (void *)((long)pvVar28 + (long)iVar12 * 8);
    } while (uVar23 != uVar27);
  }
  info("Objective value = %lf\n",dVar51);
  info("nSV = %d\n",(ulong)uVar11);
  operator_delete__(__s);
  operator_delete__(alpha_new);
  operator_delete__(pvVar14);
  operator_delete__(pvVar15);
  operator_delete__(pvVar16);
  operator_delete__(pvVar17);
  operator_delete__(pvVar18);
  operator_delete__(pvVar19);
  operator_delete__(pvVar20);
  return;
}

Assistant:

void Solver_MCSVM_CS::Solve(double *w)
{
	int i, m, s;
	int iter = 0;
	double *alpha =  new double[l*nr_class];
	double *alpha_new = new double[nr_class];
	int *index = new int[l];
	double *QD = new double[l];
	int *d_ind = new int[nr_class];
	double *d_val = new double[nr_class];
	int *alpha_index = new int[nr_class*l];
	int *y_index = new int[l];
	int active_size = l;
	int *active_size_i = new int[l];
	double eps_shrink = max(10.0*eps, 1.0); // stopping tolerance for shrinking
	bool start_from_all = true;

	// Initial alpha can be set here. Note that 
	// sum_m alpha[i*nr_class+m] = 0, for all i=1,...,l-1
	// alpha[i*nr_class+m] <= C[GETI(i)] if prob->y[i] == m
	// alpha[i*nr_class+m] <= 0 if prob->y[i] != m
	// If initial alpha isn't zero, uncomment the for loop below to initialize w
	for(i=0;i<l*nr_class;i++)
		alpha[i] = 0;

	for(i=0;i<w_size*nr_class;i++)
		w[i] = 0;
	for(i=0;i<l;i++)
	{
		for(m=0;m<nr_class;m++)
			alpha_index[i*nr_class+m] = m;
		feature_node *xi = prob->x[i];
		QD[i] = 0;
		while(xi->index != -1)
		{
			double val = xi->value;
			QD[i] += val*val;

			// Uncomment the for loop if initial alpha isn't zero
			// for(m=0; m<nr_class; m++)
			//	w[(xi->index-1)*nr_class+m] += alpha[i*nr_class+m]*val;
			xi++;
		}
		active_size_i[i] = nr_class;
		y_index[i] = (int)prob->y[i];
		index[i] = i;
	}

	while(iter < max_iter)
	{
		double stopping = -INF;
		for(i=0;i<active_size;i++)
		{
			int j = i+rand()%(active_size-i);
			swap(index[i], index[j]);
		}
		for(s=0;s<active_size;s++)
		{
			i = index[s];
			double Ai = QD[i];
			double *alpha_i = &alpha[i*nr_class];
			int *alpha_index_i = &alpha_index[i*nr_class];

			if(Ai > 0)
			{
				for(m=0;m<active_size_i[i];m++)
					G[m] = 1;
				if(y_index[i] < active_size_i[i])
					G[y_index[i]] = 0;

				feature_node *xi = prob->x[i];
				while(xi->index!= -1)
				{
					double *w_i = &w[(xi->index-1)*nr_class];
					for(m=0;m<active_size_i[i];m++)
						G[m] += w_i[alpha_index_i[m]]*(xi->value);
					xi++;
				}

				double minG = INF;
				double maxG = -INF;
				for(m=0;m<active_size_i[i];m++)
				{
					if(alpha_i[alpha_index_i[m]] < 0 && G[m] < minG)
						minG = G[m];
					if(G[m] > maxG)
						maxG = G[m];
				}
				if(y_index[i] < active_size_i[i])
					if(alpha_i[(int) prob->y[i]] < C[GETI(i)] && G[y_index[i]] < minG)
						minG = G[y_index[i]];

				for(m=0;m<active_size_i[i];m++)
				{
					if(be_shrunk(i, m, y_index[i], alpha_i[alpha_index_i[m]], minG))
					{
						active_size_i[i]--;
						while(active_size_i[i]>m)
						{
							if(!be_shrunk(i, active_size_i[i], y_index[i],
											alpha_i[alpha_index_i[active_size_i[i]]], minG))
							{
								swap(alpha_index_i[m], alpha_index_i[active_size_i[i]]);
								swap(G[m], G[active_size_i[i]]);
								if(y_index[i] == active_size_i[i])
									y_index[i] = m;
								else if(y_index[i] == m)
									y_index[i] = active_size_i[i];
								break;
							}
							active_size_i[i]--;
						}
					}
				}

				if(active_size_i[i] <= 1)
				{
					active_size--;
					swap(index[s], index[active_size]);
					s--;
					continue;
				}

				if(maxG-minG <= 1e-12)
					continue;
				else
					stopping = max(maxG - minG, stopping);

				for(m=0;m<active_size_i[i];m++)
					B[m] = G[m] - Ai*alpha_i[alpha_index_i[m]] ;

				solve_sub_problem(Ai, y_index[i], C[GETI(i)], active_size_i[i], alpha_new);
				int nz_d = 0;
				for(m=0;m<active_size_i[i];m++)
				{
					double d = alpha_new[m] - alpha_i[alpha_index_i[m]];
					alpha_i[alpha_index_i[m]] = alpha_new[m];
					if(fabs(d) >= 1e-12)
					{
						d_ind[nz_d] = alpha_index_i[m];
						d_val[nz_d] = d;
						nz_d++;
					}
				}

				xi = prob->x[i];
				while(xi->index != -1)
				{
					double *w_i = &w[(xi->index-1)*nr_class];
					for(m=0;m<nz_d;m++)
						w_i[d_ind[m]] += d_val[m]*xi->value;
					xi++;
				}
			}
		}

		iter++;
		if(iter % 10 == 0)
		{
			info(".");
		}

		if(stopping < eps_shrink)
		{
			if(stopping < eps && start_from_all == true)
				break;
			else
			{
				active_size = l;
				for(i=0;i<l;i++)
					active_size_i[i] = nr_class;
				info("*");
				eps_shrink = max(eps_shrink/2, eps);
				start_from_all = true;
			}
		}
		else
			start_from_all = false;
	}

	info("\noptimization finished, #iter = %d\n",iter);
	if (iter >= max_iter)
		info("\nWARNING: reaching max number of iterations\n");

	// calculate objective value
	double v = 0;
	int nSV = 0;
	for(i=0;i<w_size*nr_class;i++)
		v += w[i]*w[i];
	v = 0.5*v;
	for(i=0;i<l*nr_class;i++)
	{
		v += alpha[i];
		if(fabs(alpha[i]) > 0)
			nSV++;
	}
	for(i=0;i<l;i++)
		v -= alpha[i*nr_class+(int)prob->y[i]];
	info("Objective value = %lf\n",v);
	info("nSV = %d\n",nSV);

	delete [] alpha;
	delete [] alpha_new;
	delete [] index;
	delete [] QD;
	delete [] d_ind;
	delete [] d_val;
	delete [] alpha_index;
	delete [] y_index;
	delete [] active_size_i;
}